

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithchk.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  int iVar1;
  Akind *pAVar2;
  FILE *f;
  int Ldef;
  Akind *a;
  
  __stream = _stdout;
  pAVar2 = icheck();
  if (pAVar2 == (Akind *)0x0) {
    fprintf(__stream,"/* Unknown arithmetic */\n");
    a._4_4_ = 1;
  }
  else {
    fprintf(__stream,"#define %s\n#define Arith_Kind_ASL %d\n",pAVar2->name,
            (ulong)(uint)pAVar2->kind);
    fprintf(__stream,"#define Long int\n#define Intcast (int)(long)\n");
    if (dalign != 0) {
      fprintf(__stream,"#define Double_Align\n");
    }
    fprintf(__stream,"#define X64_bit_pointers\n");
    if ((pAVar2->kind < 3) && (iVar1 = fzcheck(), iVar1 != 0)) {
      fprintf(__stream,"#define Sudden_Underflow\n");
    }
    a._4_4_ = 0;
  }
  return a._4_4_;
}

Assistant:

int
main()
{
	Akind *a = 0;
	int Ldef = 0;
	FILE *f;

#ifdef WRITE_ARITH_H	/* for Symantec's buggy "make" */
	f = fopen("arith.h", "w");
	if (!f) {
		printf("Cannot open arith.h\n");
		return 1;
		}
#else
	f = stdout;
#endif

	if (sizeof(double) == 2*sizeof(long))
		a = Lcheck();
	else if (sizeof(double) == 2*sizeof(int)) {
		Ldef = 1;
		a = icheck();
		}
	else if (sizeof(double) == sizeof(long))
		a = ccheck();
	if (a) {
		fprintf(f, "#define %s\n#define Arith_Kind_ASL %d\n",
			a->name, a->kind);
		if (Ldef)
			fprintf(f, "#define Long int\n#define Intcast (int)(long)\n");
		if (dalign)
			fprintf(f, "#define Double_Align\n");
		if (sizeof(char*) == 8)
			fprintf(f, "#define X64_bit_pointers\n");
#ifndef NO_LONG_LONG
		if (sizeof(long long) < 8)
#endif
			fprintf(f, "#define NO_LONG_LONG\n");
		if (a->kind <= 2 && fzcheck())
			fprintf(f, "#define Sudden_Underflow\n");
		return 0;
		}
	fprintf(f, "/* Unknown arithmetic */\n");
	return 1;
	}